

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O2

void printopaquemem(MCInst *MI,uint OpNo,SStream *O)

{
  uint uVar1;
  cs_mode cVar2;
  uint8_t uVar3;
  
  uVar1 = MI->flat_insn->id;
  if (((((0x26 < uVar1 - 0x9a) || ((0x5000000003U >> ((ulong)(uVar1 - 0x9a) & 0x3f) & 1) == 0)) &&
       (uVar1 != 0x147)) && ((uVar1 != 0x149 && (uVar1 != 0x283)))) && (uVar1 != 0x293)) {
    SStream_concat0(O,"ptr ");
  }
  cVar2 = MI->csh->mode;
  if (cVar2 == CS_MODE_64) {
    uVar1 = MI->flat_insn->id;
    if (((uVar1 - 0x9a < 2) || (uVar1 == 0x147)) ||
       ((uVar1 == 0x149 || ((uVar1 == 0x293 || (uVar3 = '\b', uVar1 == 0x283)))))) {
      uVar3 = '\n';
    }
  }
  else if (cVar2 == CS_MODE_32) {
    uVar1 = MI->flat_insn->id;
    if ((((uVar1 - 0x9a < 2) || (uVar1 == 0x147)) || (uVar1 == 0x149)) ||
       ((uVar1 == 0x293 || (uVar3 = '\x04', uVar1 == 0x283)))) {
LAB_00222127:
      uVar3 = '\x06';
    }
  }
  else {
    if (cVar2 != CS_MODE_16) goto LAB_0022216e;
    uVar1 = MI->flat_insn->id;
    if (uVar1 - 0x9a < 2) {
      uVar3 = '\x04';
    }
    else if (((uVar1 == 0x147) || (uVar1 == 0x149)) ||
            ((uVar1 == 0x283 || (uVar3 = '\x02', uVar1 == 0x293)))) goto LAB_00222127;
  }
  MI->x86opsize = uVar3;
LAB_0022216e:
  printMemReference(MI,OpNo,O);
  return;
}

Assistant:

static void printopaquemem(MCInst *MI, unsigned OpNo, SStream *O)
{
	switch(MI->csh->mode) {
		case CS_MODE_16:
			switch(MI->flat_insn->id) {
				default:
					MI->x86opsize = 2;
					break;
				case X86_INS_LJMP:
				case X86_INS_LCALL:
					MI->x86opsize = 4;
					break;
				case X86_INS_SGDT:
				case X86_INS_SIDT:
				case X86_INS_LGDT:
				case X86_INS_LIDT:
					MI->x86opsize = 6;
					break;
			}
			break;
		case CS_MODE_32:
			switch(MI->flat_insn->id) {
				default:
					MI->x86opsize = 4;
					break;
				case X86_INS_LJMP:
				case X86_INS_LCALL:
				case X86_INS_SGDT:
				case X86_INS_SIDT:
				case X86_INS_LGDT:
				case X86_INS_LIDT:
					MI->x86opsize = 6;
					break;
			}
			break;
		case CS_MODE_64:
			switch(MI->flat_insn->id) {
				default:
					MI->x86opsize = 8;
					break;
				case X86_INS_LJMP:
				case X86_INS_LCALL:
				case X86_INS_SGDT:
				case X86_INS_SIDT:
				case X86_INS_LGDT:
				case X86_INS_LIDT:
					MI->x86opsize = 10;
					break;
			}
			break;
		default:	// never reach
			break;
	}

	printMemReference(MI, OpNo, O);
}